

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O2

void __thiscall
htmlcxx2::HTML::ParserSax::parseTag<char_const*>(ParserSax *this,char *begin,char *pos)

{
  char cVar1;
  ParserSax *pPVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  string name;
  string text;
  Node node;
  allocator<char> local_149;
  ParserSax *local_148;
  string local_140;
  string local_120;
  string local_100;
  Node local_e0;
  
  cVar1 = begin[1];
  pbVar4 = (byte *)(begin + 1);
  local_148 = this;
  pbVar6 = (byte *)(begin + 1);
  if (cVar1 == '/') {
    pbVar4 = (byte *)(begin + 2);
    pbVar6 = (byte *)(begin + 2);
  }
  while ((pbVar7 = (byte *)pos, pbVar4 != (byte *)pos &&
         (iVar3 = isalnum((uint)*pbVar4), pbVar7 = pbVar4, iVar3 != 0))) {
    pbVar4 = pbVar4 + 1;
  }
  local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,pbVar6,pbVar7);
  if (cVar1 != '/') {
    for (lVar5 = 0; lVar5 != 0x37; lVar5 = lVar5 + 0xb) {
      if (local_140._M_string_length == (long)(char)(&impl::LITERAL_MODE_ELEM)[lVar5]) {
        iVar3 = impl::icompare<char>(local_140._M_dataplus._M_p,"script" + lVar5);
        if (iVar3 == 0) {
          local_148->literal_ = "script" + lVar5;
          break;
        }
      }
    }
  }
  local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,begin,pos);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"",&local_149);
  pPVar2 = local_148;
  Node::Node(&local_e0,&local_140,&local_120,&local_100,local_148->currentOffset_,
             local_120._M_string_length,NODE_TAG);
  std::__cxx11::string::~string((string *)&local_100);
  pPVar2->currentOffset_ = pPVar2->currentOffset_ + local_e0.length_;
  (*pPVar2->_vptr_ParserSax[3])(pPVar2,&local_e0,(ulong)(cVar1 == '/'));
  Node::~Node(&local_e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  return;
}

Assistant:

void ParserSax::parseTag(It begin, It pos)
{
    It name_begin(begin);
    ++name_begin;
    bool isClosingTag = (*name_begin == '/');
    if (isClosingTag)
        ++name_begin;
    It name_end(name_begin);
    while ((name_end != pos) && ::isalnum((unsigned char)*name_end))
        ++name_end;
    std::string name(name_begin, name_end);

    if (!isClosingTag)
    {
        const size_t arrCount = sizeof(impl::LITERAL_MODE_ELEM) /
                sizeof(impl::LITERAL_MODE_ELEM[0]);
        const size_t tagLen = name.length();
        for (size_t i = 0; i < arrCount; ++i)
            if ((tagLen == static_cast<size_t>(impl::LITERAL_MODE_ELEM[i][0]))
                    && (impl::icompare(name.c_str(), &impl::LITERAL_MODE_ELEM[i][1]) == 0))
                {
                    literal_ = &impl::LITERAL_MODE_ELEM[i][1];
                    break;
                }
    }

    //by now, length is just the size of the tag
    std::string text(begin, pos);
    Node node(name, text, "", currentOffset_, text.length(), Node::NODE_TAG);
    currentOffset_ += node.length();
    onFoundTag(node, isClosingTag);
}